

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

int __thiscall World::GeneratePlayerID(World *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  list<Client_*,_std::allocator<Client_*>_> *plVar5;
  _List_node_base *p_Var6;
  
  plVar5 = &(this->server->super_Server).clients;
  iVar4 = 1;
  p_Var6 = (_List_node_base *)plVar5;
LAB_00199b73:
  do {
    p_Var2 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var6->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    iVar3 = iVar4;
    if (p_Var2 != (_List_node_base *)plVar5) {
      iVar1 = *(int *)((long)p_Var2[1]._M_next + 0x110);
      p_Var6 = p_Var2;
      iVar3 = iVar1 + 1;
      if (iVar1 != iVar4) goto LAB_00199b73;
    }
    iVar4 = iVar3;
    p_Var6 = (_List_node_base *)plVar5;
    if (p_Var2 == (_List_node_base *)plVar5) {
      return iVar4;
    }
  } while( true );
}

Assistant:

int World::GeneratePlayerID()
{
	unsigned int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->id == lowest_free_id)
		{
			lowest_free_id = eoclient->id + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}